

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O1

int AF_A_FreezeDeath(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  AActor *ent;
  undefined8 *puVar3;
  player_t *ppVar4;
  PClass *pPVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined8 uVar9;
  PClass *pPVar10;
  undefined4 extraout_var_00;
  char *__assertion;
  bool bVar11;
  FSoundID local_2c;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005da9a1;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    ent = (AActor *)(param->field_0).field_1.a;
    if (ent != (AActor *)0x0) {
      if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
        (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
      }
      pPVar10 = (ent->super_DThinker).super_DObject.Class;
      bVar11 = pPVar10 != (PClass *)0x0;
      if (pPVar10 != pPVar5 && bVar11) {
        do {
          pPVar10 = pPVar10->ParentClass;
          bVar11 = pPVar10 != (PClass *)0x0;
          if (pPVar10 == pPVar5) break;
        } while (pPVar10 != (PClass *)0x0);
      }
      if (!bVar11) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005da9a1;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005da976;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar9 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar9;
        }
        pPVar10 = (PClass *)puVar3[1];
        bVar11 = pPVar10 != (PClass *)0x0;
        if (pPVar10 != pPVar5 && bVar11) {
          do {
            pPVar10 = pPVar10->ParentClass;
            bVar11 = pPVar10 != (PClass *)0x0;
            if (pPVar10 == pPVar5) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005da9a1;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      uVar7 = FRandom::GenRand32(&pr_freezedeath);
      uVar8 = FRandom::GenRand32(&pr_freezedeath);
      ent->tics = (uVar8 & 0xff) + (uVar7 & 0xff) + 0x4b;
      (ent->flags).Value = (ent->flags).Value | 0x80080006;
      (ent->flags2).Value = (ent->flags2).Value | 0x41600;
      pbVar1 = (byte *)((long)&(ent->flags3).Value + 2);
      *pbVar1 = *pbVar1 | 0x20;
      if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
        (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar6);
      }
      ent->Height = *(double *)(((ent->super_DThinker).super_DObject.Class)->Defaults + 0x160);
      if (((ent->RenderStyle).field_0.BlendOp & 0xfc) == 4) {
        ent->RenderStyle = LegacyRenderStyles[1];
      }
      local_2c.ID = S_FindSound("misc/freeze");
      S_Sound(ent,4,&local_2c,1.0,1.0);
      if (((ent->flags).Value & 0x40000000) != 0) {
        ent->Alpha = 1.0;
        ent->visdir = '\0';
      }
      ppVar4 = ent->player;
      if (ppVar4 == (player_t *)0x0) {
        if ((((ent->flags3).Value & 0x2000) != 0) && (ent->special != 0)) {
          P_ExecuteSpecial(ent->special,(line_t *)0x0,ent,false,ent->args[0],ent->args[1],
                           ent->args[2],ent->args[3],ent->args[4]);
          ent->special = 0;
        }
      }
      else {
        ppVar4->damagecount = 0;
        ppVar4->bonuscount = 0;
        ppVar4->poisoncount = 0;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005da976:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005da9a1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0xb9,"int AF_A_FreezeDeath(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeath)
{
	PARAM_ACTION_PROLOGUE;

	int t = pr_freezedeath();
	self->tics = 75+t+pr_freezedeath();
	self->flags |= MF_SOLID|MF_SHOOTABLE|MF_NOBLOOD|MF_ICECORPSE;
	self->flags2 |= MF2_PUSHABLE|MF2_TELESTOMP|MF2_PASSMOBJ|MF2_SLIDE;
	self->flags3 |= MF3_CRASHED;
	self->Height = self->GetDefault()->Height;
	// Remove fuzz effects from frozen actors.
	if (self->RenderStyle.BlendOp >= STYLEOP_Fuzz && self->RenderStyle.BlendOp <= STYLEOP_FuzzOrRevSub)
	{
		self->RenderStyle = STYLE_Normal;
	}

	S_Sound (self, CHAN_BODY, "misc/freeze", 1, ATTN_NORM);

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1;
		self->visdir = 0;
	}

	if (self->player)
	{
		self->player->damagecount = 0;
		self->player->poisoncount = 0;
		self->player->bonuscount = 0;
	}
	else if (self->flags3 & MF3_ISMONSTER && self->special)
	{ // Initiate monster death actions
		P_ExecuteSpecial(self->special, NULL, self, false, self->args[0],
			self->args[1], self->args[2], self->args[3], self->args[4]);
		self->special = 0;
	}
	return 0;
}